

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O3

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::
Shape*,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,Block *Target,FlowType Type,Shape *Ancestor,BlockSet *From)

{
  _List_node_base *p_Var1;
  const_iterator cVar2;
  undefined4 in_register_00000014;
  _Self __tmp;
  undefined8 *puVar3;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> pVar4;
  pair<CFG::Block_*const,_CFG::Branch_*> local_58;
  undefined4 local_44;
  Block *local_40;
  Block *Prior;
  Block *Target_local;
  
  local_44 = SUB84(Target,0);
  puVar3 = *(undefined8 **)((long)this + 0x90);
  if (puVar3 != (undefined8 *)((long)this + 0x90)) {
    Prior = (Block *)this;
    do {
      local_40 = (Block *)puVar3[2];
      cVar2 = std::
              _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)Ancestor,&local_40);
      if (cVar2.
          super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      else {
        local_58.first = Prior;
        local_58.second = (Branch *)0x0;
        pVar4 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
                          (&local_40->BranchesOut,&local_58);
        p_Var1 = pVar4.first._M_node._M_node[1]._M_prev;
        p_Var1->_M_next = (_List_node_base *)CONCAT44(in_register_00000014,Type);
        *(undefined4 *)&p_Var1->_M_prev = local_44;
        puVar3 = (undefined8 *)*puVar3;
        ::wasm::InsertOrderedSet<CFG::Block_*>::erase(&Prior->BranchesIn,&local_40);
        ::wasm::InsertOrderedSet<CFG::Block_*>::insert(&Prior->ProcessedBranchesIn,&local_40);
        ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::erase(&local_40->BranchesOut,&Prior);
        local_58.first = Prior;
        local_58.second = (Branch *)0x0;
        pVar4 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
                          (&local_40->ProcessedBranchesOut,&local_58);
        pVar4.first._M_node._M_node[1]._M_prev = p_Var1;
      }
    } while ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)puVar3 !=
             &(Prior->BranchesIn).List);
  }
  return;
}

Assistant:

void Solipsize(Block* Target,
                   Branch::FlowType Type,
                   Shape* Ancestor,
                   BlockSet& From) {
      PrintDebug("Solipsizing branches into %d\n", Target->Id);
      DebugDump(From, "  relevant to solipsize: ");
      for (auto iter = Target->BranchesIn.begin();
           iter != Target->BranchesIn.end();) {
        Block* Prior = *iter;
        if (!contains(From, Prior)) {
          iter++;
          continue;
        }
        Branch* PriorOut = Prior->BranchesOut[Target];
        PriorOut->Ancestor = Ancestor;
        PriorOut->Type = Type;
        iter++; // carefully increment iter before erasing
        Target->BranchesIn.erase(Prior);
        Target->ProcessedBranchesIn.insert(Prior);
        Prior->BranchesOut.erase(Target);
        Prior->ProcessedBranchesOut[Target] = PriorOut;
        PrintDebug("  eliminated branch from %d\n", Prior->Id);
      }
    }